

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argParserAdvancedConfiguration.cpp
# Opt level: O0

argParserAdvancedConfiguration * __thiscall
argParserAdvancedConfiguration::buildHelpLine
          (argParserAdvancedConfiguration *this,string *argvShort,string *argvLong,string *help)

{
  ulong uVar1;
  string local_108 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8 [32];
  string local_c8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8 [32];
  string local_88 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68 [54];
  allocator local_32;
  undefined1 local_31;
  string *help_local;
  string *argvLong_local;
  string *argvShort_local;
  argParserAdvancedConfiguration *this_local;
  string *s;
  
  local_31 = 0;
  help_local = help;
  argvLong_local = argvLong;
  argvShort_local = argvShort;
  this_local = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,"",&local_32);
  std::allocator<char>::~allocator((allocator<char> *)&local_32);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::operator+((char *)local_88,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"     <");
    std::operator+(local_68,(char *)local_88);
    std::__cxx11::string::operator+=((string *)this,(string *)local_68);
    std::__cxx11::string::~string((string *)local_68);
    std::__cxx11::string::~string(local_88);
  }
  while (uVar1 = std::__cxx11::string::size(), uVar1 < 0x10) {
    std::__cxx11::string::operator+=((string *)this," ");
  }
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::operator+((char *)local_c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1165cd);
    std::operator+(local_a8,(char *)local_c8);
    std::__cxx11::string::operator+=((string *)this,(string *)local_a8);
    std::__cxx11::string::~string((string *)local_a8);
    std::__cxx11::string::~string(local_c8);
  }
  while (uVar1 = std::__cxx11::string::size(), uVar1 < 0x2d) {
    std::__cxx11::string::operator+=((string *)this," ");
  }
  std::operator+((char *)local_108,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1162d7);
  std::operator+(local_e8,(char *)local_108);
  std::__cxx11::string::operator+=((string *)this,(string *)local_e8);
  std::__cxx11::string::~string((string *)local_e8);
  std::__cxx11::string::~string(local_108);
  return this;
}

Assistant:

string argParserAdvancedConfiguration::buildHelpLine(const string argvShort, const string argvLong, const string help) {
    string s = "";
    if (!argvShort.empty())
        s += "     <" + argvShort + ">";
    while (s.size() < 16)
        s += " ";
    if (!argvLong.empty())
        s += " <" + argvLong + "> ";
    while (s.size() < 45)
        s += " ";
    s += " : " + help + "\n";
    return s;
}